

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CEseqExpression::Copy(CEseqExpression *this)

{
  CEseqExpression *this_00;
  pointer pCVar1;
  pointer pCVar2;
  long in_RSI;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20 [2];
  CEseqExpression *this_local;
  
  this_local = this;
  this_00 = (CEseqExpression *)operator_new(0x18);
  pCVar1 = std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
           operator->((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)(in_RSI + 8));
  (*(pCVar1->super_IStatement).super_INode._vptr_INode[3])(&local_28);
  pCVar2 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           operator->((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)(in_RSI + 0x10));
  (*(pCVar2->super_IExpression).super_INode._vptr_INode[3])(local_40);
  CEseqExpression(this_00,&local_28,local_40);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             this,local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (local_40);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CEseqExpression::Copy( ) const {
    return std::move(
            std::unique_ptr<const IRT::CExpression>( new CEseqExpression( statement->Copy( ), expression->Copy( ))));
}